

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void plus_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_rules *v;
  Elem **ppEVar1;
  uint uVar2;
  Rule *pRVar3;
  Elem **ppEVar4;
  Rule **ppRVar5;
  int iVar6;
  Production *pPVar7;
  Rule *pRVar8;
  Elem *pEVar9;
  Elem *pEVar10;
  void *elem;
  AssocKind AVar11;
  Rule **ppRVar12;
  uint uVar13;
  
  pPVar7 = new_internal_production(g,g->p);
  pPVar7->field_0x3c = pPVar7->field_0x3c & 0xe3 | 0x10;
  pRVar8 = (Rule *)calloc(1,0xa8);
  pRVar8->prod = pPVar7;
  pEVar9 = (Elem *)calloc(1,0x20);
  pRVar8->end = pEVar9;
  pEVar9->kind = ELEM_END;
  pEVar9->rule = pRVar8;
  pRVar8->action_index = g->action_index;
  pEVar9 = (g->r->elems).v[(g->r->elems).n - 1];
  if (g->right_recursive_BNF == 0) {
    pEVar10 = (Elem *)calloc(1,0x20);
    (pEVar10->e).nterm = pPVar7;
    pEVar10->rule = pRVar8;
    (pRVar8->elems).v = (pRVar8->elems).e;
    (pRVar8->elems).n = 1;
    (pRVar8->elems).e[0] = pEVar10;
    pEVar10 = dup_elem(pEVar9,pRVar8);
    uVar2 = (pRVar8->elems).n;
    (pRVar8->elems).n = uVar2 + 1;
    (pRVar8->elems).v[uVar2] = pEVar10;
    pRVar3 = g->r;
    pEVar10 = (Elem *)calloc(1,0x20);
    (pEVar10->e).nterm = pPVar7;
    pEVar10->rule = pRVar3;
    (pRVar3->elems).v[(pRVar3->elems).n - 1] = pEVar10;
    iVar6 = g->r->rule_priority;
    AVar11 = ASSOC_NARY_LEFT;
  }
  else {
    pEVar10 = dup_elem(pEVar9,pRVar8);
    ppEVar1 = (pRVar8->elems).e;
    (pRVar8->elems).v = ppEVar1;
    uVar2 = (pRVar8->elems).n;
    uVar13 = uVar2 + 1;
    (pRVar8->elems).n = uVar13;
    (pRVar8->elems).e[uVar2] = pEVar10;
    pRVar3 = g->r;
    pEVar10 = (Elem *)calloc(1,0x20);
    (pEVar10->e).nterm = pPVar7;
    pEVar10->rule = pRVar3;
    (pRVar3->elems).v[(pRVar3->elems).n - 1] = pEVar10;
    ppEVar4 = (pRVar8->elems).v;
    if (ppEVar4 == (Elem **)0x0) {
      pEVar10 = (Elem *)calloc(1,0x20);
      (pEVar10->e).nterm = pPVar7;
      pEVar10->rule = pRVar8;
      (pRVar8->elems).v = ppEVar1;
      (pRVar8->elems).n = uVar2 + 2;
      (pRVar8->elems).e[uVar13] = pEVar10;
    }
    else {
      if (ppEVar4 == ppEVar1) {
        if (2 < uVar13) goto LAB_00139eff;
      }
      else if ((uVar13 & 7) == 0) {
LAB_00139eff:
        elem = calloc(1,0x20);
        *(Production **)((long)elem + 0x10) = pPVar7;
        *(Rule **)((long)elem + 8) = pRVar8;
        vec_add_internal(&pRVar8->elems,elem);
        goto LAB_00139f2d;
      }
      pEVar10 = (Elem *)calloc(1,0x20);
      (pEVar10->e).nterm = pPVar7;
      pEVar10->rule = pRVar8;
      (pRVar8->elems).n = uVar2 + 2;
      ppEVar4[uVar13] = pEVar10;
    }
LAB_00139f2d:
    iVar6 = g->r->rule_priority;
    AVar11 = ASSOC_NARY_RIGHT;
  }
  if (iVar6 != 0) {
    pRVar8->rule_priority = iVar6;
    pRVar8->rule_assoc = AVar11;
  }
  v = &pPVar7->rules;
  ppRVar5 = (pPVar7->rules).v;
  ppRVar12 = (pPVar7->rules).e;
  if (ppRVar5 == (Rule **)0x0) {
    (pPVar7->rules).v = ppRVar12;
    uVar2 = (pPVar7->rules).n;
    (pPVar7->rules).n = uVar2 + 1;
    (pPVar7->rules).e[uVar2] = pRVar8;
  }
  else {
    uVar2 = v->n;
    if (ppRVar5 == ppRVar12) {
      if (2 < uVar2) goto LAB_00139fa4;
    }
    else if ((uVar2 & 7) == 0) {
LAB_00139fa4:
      vec_add_internal(v,pRVar8);
      goto LAB_00139faf;
    }
    v->n = uVar2 + 1;
    ppRVar5[uVar2] = pRVar8;
  }
LAB_00139faf:
  pRVar8 = (Rule *)calloc(1,0xa8);
  pRVar8->prod = pPVar7;
  pEVar10 = (Elem *)calloc(1,0x20);
  pRVar8->end = pEVar10;
  pEVar10->kind = ELEM_END;
  pEVar10->rule = pRVar8;
  pRVar8->action_index = g->action_index;
  (pRVar8->elems).v = (pRVar8->elems).e;
  (pRVar8->elems).n = 1;
  (pRVar8->elems).e[0] = pEVar9;
  pEVar9->rule = pRVar8;
  ppRVar5 = (pPVar7->rules).v;
  if (ppRVar5 == (Rule **)0x0) {
    (pPVar7->rules).v = ppRVar12;
    uVar2 = (pPVar7->rules).n;
    (pPVar7->rules).n = uVar2 + 1;
    (pPVar7->rules).e[uVar2] = pRVar8;
  }
  else {
    uVar2 = v->n;
    if (ppRVar5 == ppRVar12) {
      if (2 < uVar2) goto LAB_0013a05e;
    }
    else if ((uVar2 & 7) == 0) {
LAB_0013a05e:
      vec_add_internal(v,pRVar8);
      return;
    }
    v->n = uVar2 + 1;
    ppRVar5[uVar2] = pRVar8;
  }
  return;
}

Assistant:

void plus_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;
  Elem *elem;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_PLUS;
  rr = new_rule(g, pp);
  if (!g->right_recursive_BNF) {
    elem = last_elem(g->r);
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    vec_add(&rr->elems, dup_elem(elem, rr));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    if (g->r->rule_priority) {
      rr->rule_priority = g->r->rule_priority;
      rr->rule_assoc = ASSOC_NARY_LEFT;
    }
  } else {
    elem = last_elem(g->r);
    vec_add(&rr->elems, dup_elem(elem, rr));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    if (g->r->rule_priority) {
      rr->rule_priority = g->r->rule_priority;
      rr->rule_assoc = ASSOC_NARY_RIGHT;
    }
  }
  vec_add(&pp->rules, rr);
  rr = new_rule(g, pp);
  vec_add(&rr->elems, elem);
  elem->rule = rr;
  vec_add(&pp->rules, rr);
}